

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QRect __thiscall QTableViewPrivate::visualSpanRect(QTableViewPrivate *this,Span *span)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  int iVar4;
  Span *in_RSI;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int colp;
  int colw;
  int column;
  int rowh;
  int rowp;
  int row;
  QTableView *q;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  QRect *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QSpanCollection::Span::top(in_RSI);
  QHeaderView::sectionViewportPosition
            ((QHeaderView *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb4);
  QSpanCollection::Span::height(in_RSI);
  rowSpanHeight((QTableViewPrivate *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  QSpanCollection::Span::left(in_RSI);
  QSpanCollection::Span::width(in_RSI);
  iVar4 = columnSpanWidth((QTableViewPrivate *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  bVar3 = QWidget::isRightToLeft((QWidget *)0x8b4091);
  if (bVar3) {
    QSpanCollection::Span::right(in_RSI);
  }
  QHeaderView::sectionViewportPosition
            ((QHeaderView *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb4);
  bVar3 = QWidget::isRightToLeft((QWidget *)0x8b40e6);
  if (bVar3) {
    QRect::QRect(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  else {
    QRect::QRect(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableViewPrivate::visualSpanRect(const QSpanCollection::Span &span) const
{
    Q_Q(const QTableView);
    // vertical
    int row = span.top();
    int rowp = verticalHeader->sectionViewportPosition(row);
    int rowh = rowSpanHeight(row, span.height());
    // horizontal
    int column = span.left();
    int colw = columnSpanWidth(column, span.width());
    if (q->isRightToLeft())
        column = span.right();
    int colp = horizontalHeader->sectionViewportPosition(column);

    const int i = showGrid ? 1 : 0;
    if (q->isRightToLeft())
        return QRect(colp + i, rowp, colw - i, rowh - i);
    return QRect(colp, rowp, colw - i, rowh - i);
}